

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LaneBasedExecutionQueue.cpp
# Opt level: O3

bool __thiscall QueueJobLess::operator()(QueueJobLess *this,QueueJob *__x,QueueJob *__y)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong __n;
  
  iVar1 = (*__x->desc->_vptr_JobDescriptor[2])();
  iVar2 = (*__y->desc->_vptr_JobDescriptor[2])();
  __n = extraout_RDX;
  if (extraout_RDX_00 < extraout_RDX) {
    __n = extraout_RDX_00;
  }
  if (__n == 0) {
LAB_001d91aa:
    uVar3 = 0;
    if (extraout_RDX == extraout_RDX_00) goto LAB_001d91bb;
    uVar3 = -(uint)(extraout_RDX < extraout_RDX_00);
  }
  else {
    iVar1 = memcmp((void *)CONCAT44(extraout_var,iVar1),(void *)CONCAT44(extraout_var_00,iVar2),__n)
    ;
    if (iVar1 == 0) goto LAB_001d91aa;
    uVar3 = iVar1 >> 0x1f;
  }
  uVar3 = uVar3 | 1;
LAB_001d91bb:
  return uVar3 == 0xffffffff;
}

Assistant:

bool operator()(const llbuild::basic::QueueJob &__x,
                  const llbuild::basic::QueueJob &__y) const {
    return __x.getDescriptor()->getOrdinalName() <
            __y.getDescriptor()->getOrdinalName();
  }